

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_strrev(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int local_40;
  int local_3c;
  int c;
  int nLen;
  char *zEnd;
  char *zIn;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zIn = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if (nArg < 1) {
    jx9_result_null(pCtx);
  }
  else {
    zEnd = jx9_value_to_string(*apArg,&local_3c);
    if (local_3c < 1) {
      jx9_result_null(pjStack_18);
    }
    else {
      for (_c = zEnd + (local_3c + -1); zEnd <= _c; _c = _c + -1) {
        local_40 = (int)*_c;
        jx9_result_string(pjStack_18,(char *)&local_40,1);
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_strrev(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIn, *zEnd;
	int nLen, c;
	if( nArg < 1 ){
		/* Missing arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zIn = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string Return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Perform the requested operation */
	zEnd = &zIn[nLen - 1];
	for(;;){
		if( zEnd < zIn ){
			/* No more input to process */
			break;
		}
		/* Append current character */
		c = zEnd[0];
		jx9_result_string(pCtx, (const char *)&c, (int)sizeof(char));
		zEnd--;
	}
	return JX9_OK;
}